

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_logist.c
# Opt level: O0

int WebRtcIsac_EncLogisticMulti2
              (Bitstr *streamdata,int16_t *dataQ7,uint16_t *envQ8,int N,int16_t isSWB12kHz)

{
  uint8_t uVar1;
  uint uVar2;
  uint local_68;
  uint local_64;
  uint local_60;
  int k;
  uint32_t cdf_hi;
  uint32_t cdf_lo;
  uint8_t *stream_ptr_carry;
  uint8_t *maxStreamPtr;
  uint8_t *stream_ptr;
  uint32_t W_upper_MSB;
  uint32_t W_upper_LSB;
  uint32_t W_upper;
  uint32_t W_lower;
  int16_t isSWB12kHz_local;
  uint16_t *puStack_28;
  int N_local;
  uint16_t *envQ8_local;
  int16_t *dataQ7_local;
  Bitstr *streamdata_local;
  
  maxStreamPtr = streamdata->stream + streamdata->stream_index;
  W_upper_MSB = streamdata->W_upper;
  local_64 = 0;
  puStack_28 = envQ8;
  envQ8_local = (uint16_t *)dataQ7;
  do {
    if (N <= (int)local_64) {
      streamdata->stream_index = (int)maxStreamPtr - (int)streamdata;
      streamdata->W_upper = W_upper_MSB;
      return 0;
    }
    k = piecewise(((short)*envQ8_local + -0x40) * (uint)*puStack_28);
    local_60 = piecewise(((short)*envQ8_local + 0x40) * (uint)*puStack_28);
    while (local_60 <= k + 1U) {
      if ((short)*envQ8_local < 1) {
        *envQ8_local = *envQ8_local + 0x80;
        k = local_60;
        local_60 = piecewise(((short)*envQ8_local + 0x40) * (uint)*puStack_28);
      }
      else {
        *envQ8_local = *envQ8_local - 0x80;
        local_60 = k;
        k = piecewise(((short)*envQ8_local + -0x40) * (uint)*puStack_28);
      }
    }
    envQ8_local = envQ8_local + 1;
    if (isSWB12kHz == 0) {
      local_68 = local_64 & 1 & (int)local_64 >> 1;
    }
    else {
      local_68 = local_64 & 1;
    }
    puStack_28 = puStack_28 + (int)local_68;
    uVar2 = ((W_upper_MSB & 0xffff) * k >> 0x10) + (W_upper_MSB >> 0x10) * k + 1;
    W_upper_MSB = (((W_upper_MSB & 0xffff) * local_60 >> 0x10) + (W_upper_MSB >> 0x10) * local_60) -
                  uVar2;
    streamdata->streamval = uVar2 + streamdata->streamval;
    if (streamdata->streamval < uVar2) {
      _cdf_hi = maxStreamPtr;
      do {
        uVar1 = _cdf_hi[-1];
        _cdf_hi[-1] = uVar1 + '\x01';
        _cdf_hi = _cdf_hi + -1;
      } while ((uint8_t)(uVar1 + '\x01') == '\0');
    }
    while ((W_upper_MSB & 0xff000000) == 0) {
      W_upper_MSB = W_upper_MSB << 8;
      *maxStreamPtr = (uint8_t)(streamdata->streamval >> 0x18);
      if (streamdata->stream + 399 < maxStreamPtr + 1) {
        return -0x1928;
      }
      streamdata->streamval = streamdata->streamval << 8;
      maxStreamPtr = maxStreamPtr + 1;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

int WebRtcIsac_EncLogisticMulti2(
    Bitstr *streamdata,      /* in-/output struct containing bitstream */
    int16_t *dataQ7,    /* input: data vector */
    const uint16_t *envQ8, /* input: side info vector defining the width of the pdf */
    const int N,       /* input: data vector length / 2 */
    const int16_t isSWB12kHz)
{
  uint32_t W_lower, W_upper;
  uint32_t W_upper_LSB, W_upper_MSB;
  uint8_t *stream_ptr;
  uint8_t *maxStreamPtr;
  uint8_t *stream_ptr_carry;
  uint32_t cdf_lo, cdf_hi;
  int k;

  /* point to beginning of stream buffer */
  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;

  maxStreamPtr = streamdata->stream + STREAM_SIZE_MAX_60 - 1;
  for (k = 0; k < N; k++)
  {
    /* compute cdf_lower and cdf_upper by evaluating the piecewise linear cdf */
    cdf_lo = piecewise((*dataQ7 - 64) * *envQ8);
    cdf_hi = piecewise((*dataQ7 + 64) * *envQ8);

    /* test and clip if probability gets too small */
    while (cdf_lo+1 >= cdf_hi) {
      /* clip */
      if (*dataQ7 > 0) {
        *dataQ7 -= 128;
        cdf_hi = cdf_lo;
        cdf_lo = piecewise((*dataQ7 - 64) * *envQ8);
      } else {
        *dataQ7 += 128;
        cdf_lo = cdf_hi;
        cdf_hi = piecewise((*dataQ7 + 64) * *envQ8);
      }
    }

    dataQ7++;
    // increment only once per 4 iterations for SWB-16kHz or WB
    // increment only once per 2 iterations for SWB-12kHz
    envQ8 += (isSWB12kHz)? (k & 1):((k & 1) & (k >> 1));


    /* update interval */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;
    W_lower = W_upper_MSB * cdf_lo;
    W_lower += (W_upper_LSB * cdf_lo) >> 16;
    W_upper = W_upper_MSB * cdf_hi;
    W_upper += (W_upper_LSB * cdf_hi) >> 16;

    /* shift interval such that it begins at zero */
    W_upper -= ++W_lower;

    /* add integer to bitstream */
    streamdata->streamval += W_lower;

    /* handle carry */
    if (streamdata->streamval < W_lower)
    {
      /* propagate carry */
      stream_ptr_carry = stream_ptr;
      while (!(++(*--stream_ptr_carry)));
    }

    /* renormalize interval, store most significant byte of streamval and update streamval */
    while ( !(W_upper & 0xFF000000) )      /* W_upper < 2^24 */
    {
      W_upper <<= 8;
      *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);

      if(stream_ptr > maxStreamPtr)
      {
        return -ISAC_DISALLOWED_BITSTREAM_LENGTH;
      }
      streamdata->streamval <<= 8;
    }
  }

  /* calculate new stream_index */
  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;

  return 0;
}